

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcAbc.c
# Opt level: O2

Abc_Ntk_t * Wlc_NtkGetInv(Wlc_Ntk_t *pNtk,Vec_Int_t *vInv,Vec_Str_t *vSop,int fVerbose)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  Abc_Ntk_t *pNtk_00;
  char *pcVar4;
  Wlc_Obj_t *pWVar5;
  Abc_Obj_t *pAVar6;
  Abc_Obj_t *pObj;
  uint uVar7;
  int iVar8;
  long lVar9;
  int i;
  char Buffer [5000];
  
  pNtk_00 = Abc_NtkAlloc(ABC_NTK_LOGIC,ABC_FUNC_SOP,1);
  pcVar4 = Extra_UtilStrsav(pNtk->pName);
  pNtk_00->pName = pcVar4;
  i = 0;
  iVar8 = 0;
  do {
    if ((pNtk->vCis).nSize <= i) {
      if (vInv->nSize == iVar8) {
        pAVar6 = Abc_NtkCreateObj(pNtk_00,ABC_OBJ_NODE);
        for (lVar9 = 0; lVar9 < pNtk_00->vPis->nSize; lVar9 = lVar9 + 1) {
          Abc_ObjAddFanin(pAVar6,(Abc_Obj_t *)pNtk_00->vPis->pArray[lVar9]);
        }
        pcVar4 = Abc_SopRegister((Mem_Flex_t *)pNtk_00->pManFunc,vSop->pArray);
        (pAVar6->field_5).pData = pcVar4;
        pObj = Abc_NtkCreateObj(pNtk_00,ABC_OBJ_PO);
        Abc_ObjAddFanin(pObj,pAVar6);
        Abc_ObjAssignName(pObj,"inv",(char *)0x0);
        return pNtk_00;
      }
      __assert_fail("Vec_IntSize(vInv) == nBits",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcAbc.c"
                    ,0x87,"Abc_Ntk_t *Wlc_NtkGetInv(Wlc_Ntk_t *, Vec_Int_t *, Vec_Str_t *, int)");
    }
    pWVar5 = Wlc_NtkCi(pNtk,i);
    if ((undefined1  [24])((undefined1  [24])*pWVar5 & (undefined1  [24])0x3f) ==
        (undefined1  [24])0x3) {
      uVar2 = pWVar5->End - pWVar5->Beg;
      uVar1 = -uVar2;
      if (0 < (int)uVar2) {
        uVar1 = uVar2;
      }
      uVar2 = uVar1 + 1;
      for (uVar7 = 0; uVar7 <= uVar1; uVar7 = uVar7 + 1) {
        iVar3 = Vec_IntEntry(vInv,iVar8 + uVar7);
        if (iVar3 != 0) break;
      }
      if (uVar2 == uVar7) {
        iVar8 = uVar2 + iVar8;
      }
      else {
        for (uVar7 = 0; uVar7 <= uVar1; uVar7 = uVar7 + 1) {
          iVar3 = Vec_IntEntry(vInv,iVar8 + uVar7);
          if (iVar3 != 0) {
            pAVar6 = Abc_NtkCreateObj(pNtk_00,ABC_OBJ_PI);
            pcVar4 = Wlc_ObjName(pNtk,(int)(((long)pWVar5 - (long)pNtk->pObjs) / 0x18));
            sprintf(Buffer,"%s[%d]",pcVar4,(ulong)uVar7);
            Abc_ObjAssignName(pAVar6,Buffer,(char *)0x0);
          }
        }
        iVar8 = uVar2 + iVar8;
      }
    }
    i = i + 1;
  } while( true );
}

Assistant:

Abc_Ntk_t * Wlc_NtkGetInv( Wlc_Ntk_t * pNtk, Vec_Int_t * vInv, Vec_Str_t * vSop, int fVerbose )
{
    Wlc_Obj_t * pObj;
    int i, k, nNum, nRange, nBits = 0;
    Abc_Ntk_t * pMainNtk = NULL;
    Abc_Obj_t * pMainObj, * pMainTemp;
    char Buffer[5000];
    // start the network
    pMainNtk = Abc_NtkAlloc( ABC_NTK_LOGIC, ABC_FUNC_SOP, 1 );
    // duplicate the name and the spec
    pMainNtk->pName = Extra_UtilStrsav(pNtk->pName);
    // create primary inputs
    Wlc_NtkForEachCi( pNtk, pObj, i )
    {
        if ( pObj->Type != WLC_OBJ_FO )
            continue;
        nRange = Wlc_ObjRange(pObj);
        for ( k = 0; k < nRange; k++ )
        {
            nNum = Vec_IntEntry(vInv, nBits + k);
            if ( nNum )
                break;
        }
        if ( k == nRange )
        {
            nBits += nRange;
            continue;
        }
        //printf( "%s[%d:%d] : ", Wlc_ObjName(pNtk, Wlc_ObjId(pNtk, pObj)), pObj->End, pObj->Beg );
        for ( k = 0; k < nRange; k++ )
        {
            nNum = Vec_IntEntry( vInv, nBits + k );
            if ( nNum == 0 )
                continue;
            //printf( "  [%d] -> %d", k, nNum );
            pMainObj = Abc_NtkCreatePi( pMainNtk );
            sprintf( Buffer, "%s[%d]", Wlc_ObjName(pNtk, Wlc_ObjId(pNtk, pObj)), k );
            Abc_ObjAssignName( pMainObj, Buffer, NULL );

        }
        //printf( "\n");
        nBits += nRange;
    }
    //printf( "%d %d\n", Vec_IntSize(vInv), nBits );
    assert( Vec_IntSize(vInv) == nBits );
    // create node
    pMainObj = Abc_NtkCreateNode( pMainNtk );
    Abc_NtkForEachPi( pMainNtk, pMainTemp, i )
        Abc_ObjAddFanin( pMainObj, pMainTemp );
    pMainObj->pData = Abc_SopRegister( (Mem_Flex_t *)pMainNtk->pManFunc, Vec_StrArray(vSop) );
    // create PO
    pMainTemp = Abc_NtkCreatePo( pMainNtk );
    Abc_ObjAddFanin( pMainTemp, pMainObj );
    Abc_ObjAssignName( pMainTemp, "inv", NULL );
    return pMainNtk;
}